

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
          (TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *this,
          StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *combinedInfos,bool toSubTypes,
          bool toSuperTypes)

{
  HeapType type_00;
  bool bVar1;
  reference __in;
  type *ptVar2;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_00;
  HeapType *pHVar3;
  Struct *pSVar4;
  size_type sVar5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_01;
  reference pHVar6;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar7;
  FieldInfo *pFVar8;
  FieldInfo *pFVar9;
  optional<wasm::HeapType> oVar10;
  uint local_184;
  Index i_1;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *subInfos;
  HeapType subType;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range5;
  size_type numFields;
  uint local_134;
  Index i;
  FieldList *superFields;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *superInfos;
  optional<wasm::HeapType> superType;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *infos;
  HeapType type_1;
  type *_;
  type *type;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
  local_c0;
  iterator __end0;
  iterator __begin0;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *__range3;
  UniqueDeferredQueue<wasm::HeapType> work;
  bool toSuperTypes_local;
  bool toSubTypes_local;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *combinedInfos_local;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *this_local;
  
  work.count._M_h._M_single_bucket._6_1_ = toSuperTypes;
  work.count._M_h._M_single_bucket._7_1_ = toSubTypes;
  UniqueDeferredQueue<wasm::HeapType>::UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::HeapType> *)&__range3);
  __end0 = std::
           unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           ::begin(&combinedInfos->
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  );
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ::end(&combinedInfos->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            );
  while (bVar1 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
                            ,&local_c0), bVar1) {
    __in = std::__detail::
           _Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_false,_true>
           ::operator*(&__end0);
    ptVar2 = std::
             get<0ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>
                       (__in);
    std::
    get<1ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>
              (__in);
    UniqueDeferredQueue<wasm::HeapType>::push
              ((UniqueDeferredQueue<wasm::HeapType> *)&__range3,(HeapType)ptVar2->id);
    std::__detail::
    _Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_false,_true>
    ::operator++(&__end0);
  }
  while (bVar1 = UniqueDeferredQueue<wasm::HeapType>::empty
                           ((UniqueDeferredQueue<wasm::HeapType> *)&__range3),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ =
         UniqueDeferredQueue<wasm::HeapType>::pop((UniqueDeferredQueue<wasm::HeapType> *)&__range3);
    infos = (StructValues<wasm::(anonymous_namespace)::FieldInfo> *)
            superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_;
    this_00 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                        (combinedInfos,
                         (HeapType)
                         superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._8_8_);
    if ((work.count._M_h._M_single_bucket._6_1_ & 1) != 0) {
      oVar10 = HeapType::getSuperType((HeapType *)&infos);
      superInfos = oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
      superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&superInfos);
      if (bVar1) {
        pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&superInfos);
        pSVar7 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           (combinedInfos,(HeapType)pHVar3->id);
        pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&superInfos);
        pSVar4 = HeapType::getStruct(pHVar3);
        for (local_134 = 0;
            sVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&pSVar4->fields),
            local_134 < sVar5; local_134 = local_134 + 1) {
          pFVar8 = StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                             (pSVar7,(ulong)local_134);
          pFVar9 = StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                             (this_00,(ulong)local_134);
          bVar1 = anon_unknown_226::FieldInfo::combine(pFVar8,pFVar9);
          if (bVar1) {
            pHVar3 = std::optional<wasm::HeapType>::operator*
                               ((optional<wasm::HeapType> *)&superInfos);
            UniqueDeferredQueue<wasm::HeapType>::push
                      ((UniqueDeferredQueue<wasm::HeapType> *)&__range3,(HeapType)pHVar3->id);
          }
        }
      }
    }
    if ((work.count._M_h._M_single_bucket._7_1_ & 1) != 0) {
      pSVar4 = HeapType::getStruct((HeapType *)&infos);
      sVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&pSVar4->fields);
      this_01 = SubTypes::getStrictSubTypes(&this->subTypes,(HeapType)infos);
      __end5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_01);
      subType.id = (uintptr_t)
                   std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                         *)&subType), bVar1) {
        pHVar6 = __gnu_cxx::
                 __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                 ::operator*(&__end5);
        type_00.id = pHVar6->id;
        pSVar7 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           (combinedInfos,type_00);
        for (local_184 = 0; local_184 < sVar5; local_184 = local_184 + 1) {
          pFVar8 = StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                             (pSVar7,(ulong)local_184);
          pFVar9 = StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                             (this_00,(ulong)local_184);
          bVar1 = anon_unknown_226::FieldInfo::combine(pFVar8,pFVar9);
          if (bVar1) {
            UniqueDeferredQueue<wasm::HeapType>::push
                      ((UniqueDeferredQueue<wasm::HeapType> *)&__range3,type_00);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end5);
      }
    }
  }
  UniqueDeferredQueue<wasm::HeapType>::~UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::HeapType> *)&__range3);
  return;
}

Assistant:

void propagate(StructValuesMap<T>& combinedInfos,
                 bool toSubTypes,
                 bool toSuperTypes) {
    UniqueDeferredQueue<HeapType> work;
    for (auto& [type, _] : combinedInfos) {
      work.push(type);
    }
    while (!work.empty()) {
      auto type = work.pop();
      auto& infos = combinedInfos[type];

      if (toSuperTypes) {
        // Propagate shared fields to the supertype.
        if (auto superType = type.getSuperType()) {
          auto& superInfos = combinedInfos[*superType];
          auto& superFields = superType->getStruct().fields;
          for (Index i = 0; i < superFields.size(); i++) {
            if (superInfos[i].combine(infos[i])) {
              work.push(*superType);
            }
          }
        }
      }

      if (toSubTypes) {
        // Propagate shared fields to the subtypes.
        auto numFields = type.getStruct().fields.size();
        for (auto subType : subTypes.getStrictSubTypes(type)) {
          auto& subInfos = combinedInfos[subType];
          for (Index i = 0; i < numFields; i++) {
            if (subInfos[i].combine(infos[i])) {
              work.push(subType);
            }
          }
        }
      }
    }
  }